

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

size_t __thiscall PStruct::PropagateMark(PStruct *this)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  
  GC::MarkArray((DObject **)(this->Fields).Array,(ulong)(this->Fields).Count);
  uVar1 = (this->Fields).Count;
  sVar2 = PSymbolTable::MarkSymbols
                    (&(this->super_PNamedType).super_PCompoundType.super_PType.Symbols);
  sVar3 = DObject::PropagateMark((DObject *)this);
  return sVar3 + sVar2 + (ulong)uVar1 * 8;
}

Assistant:

size_t PStruct::PropagateMark()
{
	GC::MarkArray(Fields);
	return Fields.Size() * sizeof(void*) + Super::PropagateMark();
}